

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O1

void tt_face_free_colr(TT_Face face)

{
  void *P;
  FT_Memory memory;
  FT_Stream stream;
  void *pvVar1;
  
  P = face->colr;
  if (P != (void *)0x0) {
    memory = (face->root).memory;
    stream = (face->root).stream;
    pvVar1 = face->mm;
    (**(code **)((long)pvVar1 + 0x70))(face,(long)P + 0x68);
    (**(code **)((long)pvVar1 + 0x68))(face,(long)P + 0x48);
    FT_Stream_ReleaseFrame(stream,(FT_Byte **)((long)P + 0x80));
    ft_mem_free(memory,P);
    return;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_colr( TT_Face  face )
  {
    FT_Stream  stream = face->root.stream;
    FT_Memory  memory = face->root.memory;

    Colr*  colr = (Colr*)face->colr;


    if ( colr )
    {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      {
        FT_Service_MultiMasters  mm = (FT_Service_MultiMasters)face->mm;


        mm->done_delta_set_idx_map( FT_FACE( face ),
                                    &colr->delta_set_idx_map );
        mm->done_item_var_store( FT_FACE( face ),
                                 &colr->var_store );
      }
#endif
      FT_FRAME_RELEASE( colr->table );
      FT_FREE( colr );
    }
  }